

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O0

void AudioBackend_SetOrganyaTimer(unsigned_short timer)

{
  unsigned_short timer_local;
  
  ma_mutex_lock(&organya_mutex);
  organya_timer = timer;
  ma_mutex_unlock(&organya_mutex);
  return;
}

Assistant:

void AudioBackend_SetOrganyaTimer(unsigned short timer)
{
	ma_mutex_lock(&organya_mutex);

	organya_timer = timer;

	ma_mutex_unlock(&organya_mutex);
}